

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

void mdef_free_recursive_lc(ph_lc_t *lc)

{
  if (lc != (ph_lc_t *)0x0) {
    if (lc->rclist != (ph_rc_t *)0x0) {
      mdef_free_recursive_rc(lc->rclist);
    }
    if (lc->next != (ph_lc_t *)0x0) {
      mdef_free_recursive_lc(lc->next);
    }
    ckd_free(lc);
    return;
  }
  return;
}

Assistant:

void
mdef_free_recursive_lc(ph_lc_t * lc)
{
    if (lc == NULL)
        return;

    if (lc->rclist)
        mdef_free_recursive_rc(lc->rclist);

    if (lc->next)
        mdef_free_recursive_lc(lc->next);

    ckd_free((void *) lc);
}